

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int RankWasHinted(pyhanabi_card_knowledge_t *knowledge)

{
  bool bVar1;
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("knowledge != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x52,"int RankWasHinted(pyhanabi_card_knowledge_t *)");
  }
  if (*in_RDI != 0) {
    bVar1 = hanabi_learning_env::HanabiHand::CardKnowledge::RankHinted((CardKnowledge *)0x135414);
    return (int)bVar1;
  }
  __assert_fail("knowledge->knowledge != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x53,"int RankWasHinted(pyhanabi_card_knowledge_t *)");
}

Assistant:

int RankWasHinted(pyhanabi_card_knowledge_t* knowledge) {
  REQUIRE(knowledge != nullptr);
  REQUIRE(knowledge->knowledge != nullptr);
  return reinterpret_cast<
             const hanabi_learning_env::HanabiHand::CardKnowledge*>(
             knowledge->knowledge)
      ->RankHinted();
}